

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,quatf *value)

{
  bool bVar1;
  float4 v;
  array<float,_4UL> local_18;
  
  bVar1 = ParseBasicTypeTuple<float,4ul>(this,&local_18);
  if (bVar1) {
    value->real = local_18._M_elems[0];
    (value->imag)._M_elems[0] = local_18._M_elems[1];
    (value->imag)._M_elems[1] = local_18._M_elems[2];
    (value->imag)._M_elems[2] = local_18._M_elems[3];
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(value::quatf *value) {
  value::float4 v;
  if (ReadBasicType(&v)) {
    value->real = v[0];
    value->imag[0] = v[1];
    value->imag[1] = v[2];
    value->imag[2] = v[3];
    return true;
  }
  return false;
}